

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tracker.cc
# Opt level: O0

Getters * google::protobuf::compiler::cpp::anon_unknown_0::StringOneofGetters
                    (Getters *__return_storage_ptr__,FieldDescriptor *field,OneofDescriptor *oneof,
                    Options *opts)

{
  OneofDescriptor *this;
  bool bVar1;
  LogMessage *pLVar2;
  undefined1 uVar3;
  char *pcVar4;
  FieldDescriptor *field_00;
  Arg *in_R8;
  Arg *in_R9;
  string_view sVar5;
  string_view input;
  string_view format;
  string_view format_00;
  string_view format_01;
  Arg *pAVar6;
  Arg local_380;
  Arg local_350;
  Arg local_320;
  basic_string_view<char,_std::char_traits<char>_> local_2f0;
  string local_2e0;
  Arg local_2c0;
  Arg local_290;
  basic_string_view<char,_std::char_traits<char>_> local_260;
  string local_250;
  string_view local_230;
  undefined1 local_219;
  AlphaNum local_218;
  undefined1 local_1e8 [8];
  string default_field;
  string local_1b8;
  Arg local_198;
  string_view local_168;
  Arg local_158;
  basic_string_view<char,_std::char_traits<char>_> local_128;
  undefined1 local_118 [8];
  string has;
  basic_string_view<char,_std::char_traits<char>_> local_c8;
  string local_b8;
  undefined1 local_88 [8];
  string field_ptr;
  string member;
  LogMessage local_40;
  Voidify local_29;
  Options *local_28;
  Options *opts_local;
  OneofDescriptor *oneof_local;
  FieldDescriptor *field_local;
  Getters *getters;
  
  pcVar4 = (char *)opts;
  local_28 = opts;
  opts_local = (Options *)oneof;
  oneof_local = (OneofDescriptor *)field;
  field_local = (FieldDescriptor *)__return_storage_ptr__;
  if (oneof == (OneofDescriptor *)0x0) {
    pcVar4 = "oneof != nullptr";
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_40,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/cpp/tracker.cc"
               ,0xef,"oneof != nullptr");
    pLVar2 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_40);
    absl::lts_20250127::log_internal::Voidify::operator&&(&local_29,pLVar2);
  }
  this = oneof_local;
  uVar3 = SUB81(pcVar4,0);
  if (oneof != (OneofDescriptor *)0x0) {
    bVar1 = ShouldSplit((FieldDescriptor *)oneof_local,local_28);
    FieldMemberName_abi_cxx11_
              ((string *)(field_ptr.field_2._M_local_buf + 8),(cpp *)this,
               (FieldDescriptor *)(ulong)bVar1,(bool)uVar3);
    std::__cxx11::string::string((string *)local_88,(string *)(field_ptr.field_2._M_local_buf + 8));
    bVar1 = IsArenaStringPtr((FieldDescriptor *)oneof_local,local_28);
    if (bVar1) {
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (&local_c8,"$0.UnsafeGetPointer()");
      pAVar6 = (Arg *)((long)&has.field_2 + 8);
      absl::lts_20250127::substitute_internal::Arg::Arg<std::allocator<char>>
                (pAVar6,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        ((long)&field_ptr.field_2 + 8));
      sVar5._M_str = (char *)pAVar6;
      sVar5._M_len = (size_t)local_c8._M_str;
      absl::lts_20250127::Substitute_abi_cxx11_
                (&local_b8,(lts_20250127 *)local_c8._M_len,sVar5,in_R8);
      std::__cxx11::string::operator=((string *)local_88,(string *)&local_b8);
      std::__cxx11::string::~string((string *)&local_b8);
    }
    uVar3 = SUB81(in_R8,0);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_128,"$0_case() == k$1");
    local_168 = OneofDescriptor::name((OneofDescriptor *)opts_local);
    absl::lts_20250127::substitute_internal::Arg::Arg(&local_158,local_168);
    sVar5 = FieldDescriptor::name((FieldDescriptor *)oneof_local);
    input._M_len = sVar5._M_str;
    default_field.field_2._8_8_ = sVar5._M_len;
    input._M_str = (char *)0x1;
    UnderscoresToCamelCase_abi_cxx11_
              (&local_1b8,(cpp *)default_field.field_2._8_8_,input,(bool)uVar3);
    absl::lts_20250127::substitute_internal::Arg::Arg<std::allocator<char>>(&local_198,&local_1b8);
    format._M_str = (char *)&local_158;
    format._M_len = (size_t)local_128._M_str;
    absl::lts_20250127::Substitute_abi_cxx11_
              ((string *)local_118,(lts_20250127 *)local_128._M_len,format,&local_198,in_R9);
    std::__cxx11::string::~string((string *)&local_1b8);
    MakeDefaultFieldName_abi_cxx11_((string *)local_1e8,(cpp *)oneof_local,field_00);
    bVar1 = IsArenaStringPtr((FieldDescriptor *)oneof_local,local_28);
    if (bVar1) {
      absl::lts_20250127::AlphaNum::AlphaNum(&local_218,".get()");
      absl::lts_20250127::StrAppend((Nonnull<std::string_*>)local_1e8,&local_218);
    }
    local_219 = 0;
    Getters::Getters(__return_storage_ptr__);
    local_230 = FieldDescriptor::default_value_string((FieldDescriptor *)oneof_local);
    bVar1 = std::basic_string_view<char,_std::char_traits<char>_>::empty(&local_230);
    if (bVar1) {
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (&local_260,"$0 ? $1 : nullptr");
      absl::lts_20250127::substitute_internal::Arg::Arg<std::allocator<char>>
                (&local_290,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_118);
      absl::lts_20250127::substitute_internal::Arg::Arg<std::allocator<char>>
                (&local_2c0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_88);
      format_00._M_str = (char *)&local_290;
      format_00._M_len = (size_t)local_260._M_str;
      absl::lts_20250127::Substitute_abi_cxx11_
                (&local_250,(lts_20250127 *)local_260._M_len,format_00,&local_2c0,in_R9);
      std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_250);
      std::__cxx11::string::~string((string *)&local_250);
    }
    else {
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (&local_2f0,"$0 ? $1 : &$2");
      pAVar6 = &local_320;
      absl::lts_20250127::substitute_internal::Arg::Arg<std::allocator<char>>
                (pAVar6,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        local_118);
      absl::lts_20250127::substitute_internal::Arg::Arg<std::allocator<char>>
                (&local_350,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_88);
      absl::lts_20250127::substitute_internal::Arg::Arg<std::allocator<char>>
                (&local_380,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1e8);
      format_01._M_str = (char *)pAVar6;
      format_01._M_len = (size_t)local_2f0._M_str;
      absl::lts_20250127::Substitute_abi_cxx11_
                (&local_2e0,(lts_20250127 *)local_2f0._M_len,format_01,&local_350,&local_380,pAVar6)
      ;
      std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_2e0);
      std::__cxx11::string::~string((string *)&local_2e0);
    }
    std::__cxx11::string::operator=
              ((string *)&__return_storage_ptr__->for_flat,(string *)__return_storage_ptr__);
    local_219 = 1;
    std::__cxx11::string::~string((string *)local_1e8);
    std::__cxx11::string::~string((string *)local_118);
    std::__cxx11::string::~string((string *)local_88);
    std::__cxx11::string::~string((string *)(field_ptr.field_2._M_local_buf + 8));
    return __return_storage_ptr__;
  }
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_40);
}

Assistant:

Getters StringOneofGetters(const FieldDescriptor* field,
                           const OneofDescriptor* oneof, const Options& opts) {
  ABSL_CHECK(oneof != nullptr);

  std::string member = FieldMemberName(field, ShouldSplit(field, opts));

  std::string field_ptr = member;
  if (IsArenaStringPtr(field, opts)) {
    field_ptr = absl::Substitute("$0.UnsafeGetPointer()", member);
  }

  std::string has =
      absl::Substitute("$0_case() == k$1", oneof->name(),
                       UnderscoresToCamelCase(field->name(), true));

  std::string default_field = MakeDefaultFieldName(field);
  if (IsArenaStringPtr(field, opts)) {
    absl::StrAppend(&default_field, ".get()");
  }

  Getters getters;
  if (field->default_value_string().empty()
  ) {
    getters.base = absl::Substitute("$0 ? $1 : nullptr", has, field_ptr);
  } else {
    getters.base =
        absl::Substitute("$0 ? $1 : &$2", has, field_ptr, default_field);
  }

  getters.for_flat = getters.base;
  return getters;
}